

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiAreaPrivate::internalRaise(QMdiAreaPrivate *this,QMdiSubWindow *mdiChild)

{
  undefined8 *puVar1;
  long lVar2;
  QArrayData *pQVar3;
  QPointer<QMdiSubWindow> *pQVar4;
  long lVar5;
  bool bVar6;
  QWidget *this_00;
  long lVar7;
  QWidget *w;
  int __sig;
  QWidget *pQVar8;
  const_iterator __begin2;
  undefined8 *puVar9;
  
  __sig = 0x6da586;
  bVar6 = sanityCheck(mdiChild,"QMdiArea::internalRaise");
  if ((!bVar6) || ((ulong)(this->childWindows).d.size < 2)) {
    return;
  }
  if ((mdiChild == (QMdiSubWindow *)0x0) ||
     (((((mdiChild->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>
       .super_QFlagsStorage<Qt::WindowType>.i & 0x40000) == 0)) {
    lVar2 = *(long *)&((this->super_QAbstractScrollAreaPrivate).viewport)->field_0x8;
    pQVar3 = *(QArrayData **)(lVar2 + 0x18);
    puVar9 = *(undefined8 **)(lVar2 + 0x20);
    lVar2 = *(long *)(lVar2 + 0x28);
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (lVar2 == 0) {
      w = (QWidget *)0x0;
    }
    else {
      puVar1 = puVar9 + lVar2;
      w = (QWidget *)0x0;
      do {
        pQVar8 = (QWidget *)*puVar9;
        this_00 = (QWidget *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
        if ((this_00 == (QWidget *)0x0) || (lVar2 = (this->childWindows).d.size, lVar2 == 0)) {
LAB_0043f69d:
          __sig = (int)pQVar8;
        }
        else {
          pQVar4 = (this->childWindows).d.ptr;
          lVar7 = 0;
          do {
            if (lVar2 << 4 == lVar7) goto LAB_0043f69d;
            lVar5 = *(long *)((long)&(pQVar4->wp).d + lVar7);
            if ((lVar5 == 0) || (*(int *)(lVar5 + 4) == 0)) {
              pQVar8 = (QWidget *)0x0;
            }
            else {
              pQVar8 = *(QWidget **)((long)&(pQVar4->wp).value + lVar7);
            }
            lVar7 = lVar7 + 0x10;
          } while (pQVar8 != this_00);
          if (((lVar7 == 0) || ((this_00->data->widget_attributes & 0x10000) != 0)) ||
             (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i & 0x40000) == 0)) goto LAB_0043f69d;
          if (w == (QWidget *)0x0) {
            QWidget::raise(this_00,(int)pQVar8);
            __sig = (int)pQVar8;
            w = this_00;
          }
          else {
            QWidget::stackUnder(this_00,w);
            __sig = (int)w;
            w = this_00;
          }
        }
        puVar9 = puVar9 + 1;
      } while (puVar9 != puVar1);
    }
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        __sig = 8;
        QArrayData::deallocate(pQVar3,8,0x10);
      }
    }
    if (w != (QWidget *)0x0) {
      QWidget::stackUnder(&mdiChild->super_QWidget,w);
      return;
    }
  }
  QWidget::raise(&mdiChild->super_QWidget,__sig);
  return;
}

Assistant:

void QMdiAreaPrivate::internalRaise(QMdiSubWindow *mdiChild) const
{
    if (!sanityCheck(mdiChild, "QMdiArea::internalRaise") || childWindows.size() < 2)
        return;

    QMdiSubWindow *stackUnderChild = nullptr;
    if (!windowStaysOnTop(mdiChild)) {
        const auto children = viewport->children(); // take a copy, as raising/stacking under changes the order
        for (QObject *object : children) {
            QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(object);
            if (!child || !childWindows.contains(child))
                continue;
            if (!child->isHidden() && windowStaysOnTop(child)) {
                if (stackUnderChild)
                    child->stackUnder(stackUnderChild);
                else
                    child->raise();
                stackUnderChild = child;
            }
        }
    }

    if (stackUnderChild)
        mdiChild->stackUnder(stackUnderChild);
    else
        mdiChild->raise();
}